

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.cpp
# Opt level: O3

void __thiscall Steiner::outfile(Steiner *this,string *outfileName)

{
  pointer pPVar1;
  pointer pPVar2;
  int iVar3;
  pointer pPVar4;
  long lVar5;
  long *plVar6;
  ostream *poVar7;
  ulong uVar8;
  pointer pEVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  ofstream of;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  pointer piVar9;
  
  std::ofstream::ofstream((ostream *)&local_230,(string *)outfileName,_S_out);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"NumRoutedPins = ",0x10);
  plVar6 = (long *)std::ostream::operator<<((ostream *)&local_230,this->_init_p);
  std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
  std::ostream::put((char)plVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"WireLength = ",0xd);
  poVar7 = std::ostream::_M_insert<long_long>((longlong)&local_230);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  piVar9 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar9) {
    uVar8 = 0;
    uVar12 = 1;
    do {
      iVar3 = piVar9[uVar8];
      uVar8 = (ulong)iVar3;
      iVar11 = iVar3 + 0x3f;
      if (-1 < (long)uVar8) {
        iVar11 = iVar3;
      }
      if (((this->_edges_del).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar11 >> 6) +
            (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar8 & 0x3f) & 1) == 0) {
        pPVar4 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pEVar10 = (this->_edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar3 = pEVar10[uVar8].p1;
        pPVar1 = pPVar4 + iVar3;
        iVar11 = pEVar10[uVar8].p2;
        pPVar2 = pPVar4 + iVar11;
        if (pPVar4[iVar3].x != pPVar4[iVar11].x) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"H-line ",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar1->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
        if (pPVar1->y != pPVar2->y) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"V-line ",7);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
        }
      }
      piVar9 = (this->_MST).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar13 = uVar12 < (ulong)((long)(this->_MST).super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2)
      ;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar13);
  }
  pEVar10 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.super__Vector_impl_data.
      _M_finish != pEVar10) {
    uVar8 = 0;
    uVar12 = 1;
    do {
      pPVar4 = (this->_points).super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
               super__Vector_impl_data._M_start;
      pPVar1 = pPVar4 + pEVar10[uVar8].p1;
      pPVar2 = pPVar4 + pEVar10[uVar8].p2;
      if (pPVar4[pEVar10[uVar8].p1].x != pPVar4[pEVar10[uVar8].p2].x) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"H-line ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar1->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      if (pPVar1->y != pPVar2->y) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"V-line ",7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"(",1);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_230,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar1->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->x);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",",1);
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,pPVar2->y);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
      pEVar10 = (this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->_newE).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pEVar10 >> 2) * -0x3333333333333333;
      bVar13 = uVar12 <= uVar8;
      lVar5 = uVar8 - uVar12;
      uVar8 = uVar12;
      uVar12 = (ulong)((int)uVar12 + 1);
    } while (bVar13 && lVar5 != 0);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Steiner::outfile(const string& outfileName) {
  ofstream of(outfileName, ofstream::out);
  of << "NumRoutedPins = " << _init_p << endl;
  of << "WireLength = " << _MRST_cost << endl;
  for (unsigned i = 0; i < _MST.size(); ++i) {
    if (_edges_del[_MST[i]]) continue;
    Point& p1 = _points[_edges[_MST[i]].p1];
    Point& p2 = _points[_edges[_MST[i]].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  for (unsigned i = 0; i < _newE.size(); ++i) {
    Point& p1 = _points[_newE[i].p1];
    Point& p2 = _points[_newE[i].p2];
    if (p1.x != p2.x) {
      of << "H-line "
         << "(" << p1.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p1.y << ")"
         << endl;
    }
    if (p1.y != p2.y) {
      of << "V-line "
         << "(" << p2.x << "," << p1.y << ") "
         << "(" << p2.x << "," << p2.y << ")"
         << endl;
    }
  }
  of.close();
}